

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

dw_border_tile place(dw_map *map,dw_warp_index warp_idx,dw_tile tile,int lm_one,int lm_two)

{
  uint8_t uVar1;
  dw_border_tile dVar2;
  byte bVar3;
  ulong uVar4;
  uint8_t y;
  uint8_t x;
  byte local_42;
  byte local_41;
  dw_warp_index local_40;
  dw_tile local_3c;
  dw_warp *local_38;
  
  local_38 = map->warps_from;
  local_40 = warp_idx;
  local_3c = tile;
  do {
    map_find_land(map,lm_one,lm_two,&local_41,&local_42,FALSE);
    uVar1 = map->tiles[local_41][local_42];
  } while ((byte)(uVar1 - 8) < 3);
  uVar4 = (ulong)local_40;
  local_38[uVar4].map = '\x01';
  local_38[uVar4].x = local_41;
  local_38[uVar4].y = local_42;
  map->tiles[local_41][local_42] = (uint8_t)local_3c;
  bVar3 = uVar1 - 1;
  dVar2 = BORDER_GRASS;
  if (bVar3 < 7) {
    dVar2 = (&DAT_00163bb0)[bVar3];
  }
  return dVar2;
}

Assistant:

static dw_border_tile place(dw_map *map, dw_warp_index warp_idx, dw_tile tile,
        int lm_one, int lm_two)
{
    uint8_t x, y;
    dw_warp *warp;
    dw_tile old_tile;

    warp = &map->warps_from[warp_idx];

    do {
        map_find_land(map, lm_one, lm_two, &x, &y, FALSE);
        old_tile = map->tiles[x][y];
    } while (old_tile == TILE_CASTLE || old_tile == TILE_TOWN ||
             old_tile == TILE_CAVE);

    warp->map = 1;
    warp->x = x;
    warp->y = y;
    map->tiles[x][y] = tile;
    return border_for(old_tile);
}